

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

deUint32 deqp::gls::ShaderExecUtil::getVecStd430ByteAlignment(DataType type)

{
  int iVar1;
  deUint32 local_c;
  DataType type_local;
  
  iVar1 = glu::getDataTypeScalarSize(type);
  switch(iVar1) {
  case 1:
    local_c = 4;
    break;
  case 2:
    local_c = 8;
    break;
  case 3:
    local_c = 0x10;
    break;
  case 4:
    local_c = 0x10;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

static deUint32 getVecStd430ByteAlignment (glu::DataType type)
{
	switch (glu::getDataTypeScalarSize(type))
	{
		case 1:		return 4u;
		case 2:		return 8u;
		case 3:		return 16u;
		case 4:		return 16u;
		default:
			DE_ASSERT(false);
			return 0u;
	}
}